

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O3

void buzz(int type,int nd,xchar sx,xchar sy,int dx,int dy)

{
  byte *pbVar1;
  byte bVar2;
  permonst *ppVar3;
  obj *poVar4;
  boolean bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  obj *poVar10;
  char *pcVar11;
  undefined7 in_register_00000009;
  char *pcVar12;
  byte bVar13;
  char *pcVar14;
  bool bVar15;
  int tmp;
  ulong uVar16;
  long lVar17;
  monst *pmVar18;
  char *pcVar19;
  char cVar20;
  char x;
  uint uVar21;
  undefined4 in_register_0000008c;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  monst *worm;
  ulong uVar27;
  obj *obj;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  boolean shopdamage;
  boolean local_cd;
  int local_cc;
  ulong local_c8;
  int local_c0;
  uint local_bc;
  ulong local_b8;
  ulong local_b0;
  uint local_a4;
  char *local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  coord local_72;
  ulong local_70;
  ulong local_68;
  schar *local_60;
  obj *local_58;
  int local_50;
  uint local_4c;
  uint local_48;
  int local_44;
  uint local_40;
  int local_3c;
  permonst *local_38;
  
  local_c8 = CONCAT44(in_register_0000008c,dy);
  uVar21 = (uint)(byte)sx;
  local_a4 = (uint)CONCAT71(in_register_00000009,sy);
  uVar27 = (ulong)(uint)type;
  local_68 = (ulong)(uint)-type;
  if (0 < type) {
    local_68 = uVar27;
  }
  iVar7 = (int)(local_68 / 10);
  iVar8 = (int)local_68;
  local_bc = iVar8 + iVar7 * -10;
  local_cd = '\0';
  bVar29 = type - 0x1eU < 0xfffffff6;
  local_48 = type + 0x13;
  bVar30 = local_48 < 0xfffffff6;
  local_44 = iVar8 + 0x17e + iVar7 * -10;
  if (9 < type - 10U) {
    local_44 = 0;
  }
  uVar16 = local_68;
  if (type < -0x1d) {
    uVar16 = (ulong)local_bc;
  }
  local_a0 = flash_types[uVar16];
  if ((u._1052_1_ & 1) != 0) {
    if (type < 0) {
      return;
    }
    uVar21 = zap_hit_mon(u.ustuck,type,nd,&local_58);
    if (u.ustuck == (monst *)0x0) {
      u._1052_1_ = u._1052_1_ & 0xfe;
      pmVar18 = (monst *)0x0;
    }
    else {
      pcVar19 = The(local_a0);
      pcVar11 = mon_nam(u.ustuck);
      pcVar14 = "!";
      if (uVar21 < 5) {
        pcVar14 = ".";
      }
      pcVar12 = "?";
      if (-1 < (int)uVar21) {
        pcVar12 = pcVar14;
      }
      pline("%s rips into %s%s",pcVar19,pcVar11,pcVar12);
      pmVar18 = u.ustuck;
    }
    if (uVar21 == 1000) {
      pmVar18->mhp = 0;
    }
    else if (0 < pmVar18->mhp) {
      return;
    }
    killed(pmVar18);
    return;
  }
  uVar16 = (ulong)(uint)dx;
  bVar15 = iVar8 != 0x18 && (!bVar29 || !bVar30);
  local_cc = nd;
  if (type < 0) {
    newsym((int)u.ux,(int)u.uy);
  }
  uVar6 = mt_random();
  uVar28 = local_c8;
  local_72 = bhitpos;
  iVar8 = (int)local_c8;
  local_40 = (uint)bVar15;
  iVar7 = zapdir_to_effect(dx,iVar8,local_bc,bVar15);
  tmp_at(-1,iVar7);
  uVar22 = (ulong)(uVar6 + 6 + (uVar6 / 7) * -7);
  if (iVar8 == 0 && dx == 0) {
    uVar22 = 0;
  }
  bVar15 = (int)local_68 == 0x18;
  local_50 = 0xb;
  if (type != -0x18) {
    local_50 = 0;
  }
  local_4c = -(uint)(type != -0x18) | 0xfffffffd;
  local_38 = mons + 0x144;
  local_b0 = uVar27;
  while( true ) {
    uVar25 = (ulong)local_a4;
    cVar20 = (char)uVar21;
    local_70 = (ulong)(uint)(int)cVar20;
    iVar7 = (int)uVar16;
    uVar21 = cVar20 + iVar7;
    local_a4 = (int)uVar28 + local_a4;
    x = (char)uVar21;
    uVar6 = (uint)x;
    local_80 = (ulong)uVar6;
    local_3c = uVar6 - 1;
    bVar13 = (byte)local_a4;
    iVar8 = (int)(char)bVar13;
    local_c0 = iVar8;
    if ((0x4e < (byte)local_3c) || (0x14 < bVar13)) goto LAB_00297cbe;
    uVar23 = (ulong)(uVar21 & 0xff);
    uVar24 = (ulong)bVar13;
    if (level->locations[uVar23][uVar24].typ == '\0') goto LAB_00297cbe;
    local_60 = &level->locations[uVar23][uVar24].typ;
    pmVar18 = level->monsters[uVar23][uVar24];
    local_c8 = uVar28;
    local_90 = uVar24;
    local_88 = uVar23;
    if (pmVar18 != (monst *)0x0) break;
    if ((viz_array[uVar24][uVar23] & 2U) != 0) {
LAB_00296a69:
      local_b8 = uVar25;
      if ((level->locations[uVar23][uVar24].field_0x6 & 8) != 0) {
        unmap_object(uVar6,iVar8);
        newsym(uVar6,iVar8);
      }
      pmVar18 = (monst *)0x0;
LAB_00296cf4:
      worm = pmVar18;
      uVar27 = local_b0;
      if (('\x10' < *local_60) ||
         ((((byte)(cVar20 - 1U) < 0x4f && ((byte)local_b8 < 0x15)) &&
          ((viz_array[local_b8 & 0xff][(int)local_70] & 2U) != 0)))) {
        tmp_at((int)local_80,local_c0);
      }
      (*windowprocs.win_delay)();
      uVar25 = local_b8;
      goto LAB_00296d39;
    }
    bhitpos.y = bVar13;
    bhitpos.x = x;
    uVar27 = local_b0;
    if ((int)local_b0 != 0xb) {
      local_98 = uVar22;
      iVar8 = zap_over_floor(x,bVar13,(int)local_b0,&local_cd);
      uVar22 = (ulong)(uint)(iVar8 + (int)local_98);
    }
LAB_00296e9a:
    uVar28 = local_c8;
    if (((x != u.ux) || ((char)local_a4 != u.uy)) || ((int)uVar22 < 0)) goto LAB_00297c5d;
    local_98 = uVar22;
    nomul(0,(char *)0x0);
    if (((u.usteed != (monst *)0x0) && (uVar6 = mt_random(), uVar6 * -0x55555555 < 0x55555556)) &&
       ((worm = u.usteed, !bVar15 && (!bVar29 || !bVar30) ||
        (bVar5 = mon_reflects(u.usteed,(char *)0x0), worm = u.usteed, bVar5 == '\0'))))
    goto LAB_00296d9e;
    iVar8 = zap_hit_check((int)u.uac,0);
    if (iVar8 == 0) {
      The(local_a0);
      pline("%s whizzes by you!");
      goto LAB_002978d2;
    }
    local_98 = (ulong)((int)local_98 - 2);
    The(local_a0);
    pline("%s hits you!");
    if ((bVar15 || bVar29 && bVar30) &&
       ((youmonst.data == mons + 0x94 || youmonst.data == mons + 0x9d) ||
        u.uprops[0x2a].extrinsic != 0)) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00296fb1;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00296fac;
LAB_0029727e:
        ureflects("But %s reflects from your %s!","it");
      }
      else {
LAB_00296fac:
        if (ublindf != (obj *)0x0) {
LAB_00296fb1:
          if (ublindf->oartifact == '\x1d') goto LAB_0029727e;
        }
        pline("For some reason you are not affected.");
      }
      uVar16 = (ulong)(uint)-iVar7;
      uVar28 = (ulong)(uint)-(int)uVar28;
      shieldeff(x,(xchar)local_c0);
      goto LAB_002978d2;
    }
    iVar7 = 0;
    switch(local_bc) {
    case 0:
      iVar7 = 0;
      local_b8 = uVar25;
      iVar8 = local_cc;
      for (iVar26 = local_cc; iVar26 != 0; iVar26 = iVar26 + -1) {
        uVar6 = mt_random();
        iVar7 = iVar8 + uVar6 % 6;
        iVar8 = iVar7;
      }
      mana_damageu(iVar7,(monst *)0x0,local_a0,0,'\x01');
      break;
    case 1:
      iVar7 = 0;
      local_b8 = uVar25;
      iVar8 = local_cc;
      for (iVar26 = local_cc; iVar26 != 0; iVar26 = iVar26 + -1) {
        uVar6 = mt_random();
        iVar7 = iVar8 + uVar6 % 6;
        iVar8 = iVar7;
      }
      fire_damageu(iVar7,(monst *)0x0,local_a0,0,7,'\x01','\0');
      break;
    case 2:
      iVar7 = 0;
      local_b8 = uVar25;
      iVar8 = local_cc;
      for (iVar26 = local_cc; iVar26 != 0; iVar26 = iVar26 + -1) {
        uVar6 = mt_random();
        iVar7 = iVar8 + uVar6 % 6;
        iVar8 = iVar7;
      }
      cold_damageu(iVar7,(monst *)0x0,local_a0,0,7);
      break;
    case 3:
      if (u.uprops[3].intrinsic == 0 && u.uprops[3].extrinsic == 0) {
        if ((((byte)youmonst.mintrinsics & 4) != 0) || (uVar6 = 0x19, u.uprops[0x38].extrinsic != 0)
           ) goto LAB_0029784b;
      }
      else {
        if (((u.uprops[3].intrinsic >> 0x1a & 1) == 0) ||
           ((((u.uprops[3].intrinsic & 0xfbffffff) != 0 || u.uprops[3].extrinsic != 0 ||
             (((byte)youmonst.mintrinsics & 4) != 0)) || (u.uprops[0x38].extrinsic != 0)))) {
LAB_0029784b:
          shieldeff(u.ux,u.uy);
          pcVar19 = "You don\'t feel sleepy.";
          goto LAB_0029787a;
        }
        shieldeff(u.ux,u.uy);
        uVar6 = 0x19;
        if ((((u.uprops[3].intrinsic >> 0x1a & 1) != 0) &&
            ((u.uprops[3].intrinsic & 0xfbffffff) == 0 && u.uprops[3].extrinsic == 0)) &&
           (((byte)youmonst.mintrinsics & 4) == 0)) {
          uVar6 = 0x19;
          if (u.uprops[0x38].extrinsic == 0) {
            uVar6 = 0xc;
          }
        }
      }
      iVar7 = 0;
      local_b8 = uVar25;
      iVar8 = local_cc;
      for (iVar26 = local_cc; iVar26 != 0; iVar26 = iVar26 + -1) {
        uVar9 = mt_random();
        iVar7 = iVar8 + uVar9 % uVar6;
        iVar8 = iVar7;
      }
      fall_asleep(-iVar7,'\x01');
      break;
    case 4:
      if ((int)local_68 == 0x18) {
        if (u.uprops[4].intrinsic == 0 && u.uprops[4].extrinsic == 0) {
          if (((byte)youmonst.mintrinsics & 8) == 0) goto LAB_00297ae3;
        }
        else if (((((u.uprops[4].intrinsic >> 0x1a & 1) != 0) &&
                  ((u.uprops[4].intrinsic & 0xfbffffff) == 0 && u.uprops[4].extrinsic == 0)) &&
                 (((byte)youmonst.mintrinsics & 8) == 0)) &&
                (uVar6 = mt_random(),
                (uVar6 * -0x33333333 >> 1 | (uint)((uVar6 * -0x33333333 & 1) != 0) << 0x1f) <
                0x1999999a)) {
LAB_00297ae3:
          poVar10 = uarms;
          if (uarms == (obj *)0x0) {
            if (uarm == (obj *)0x0) {
              if (uarmc != (obj *)0x0) {
                destroy_arm(uarmc,'\x01');
              }
              if (uarmu != (obj *)0x0) {
                destroy_arm(uarmu,'\x01');
              }
              goto LAB_00297fd7;
            }
            poVar10 = uarm;
            if (uarmc != (obj *)0x0) {
              destroy_arm(uarmc,'\0');
              poVar10 = uarm;
            }
          }
          iVar7 = 0;
          destroy_arm(poVar10,'\0');
          goto switchD_002970ca_default;
        }
        pcVar19 = "You are not disintegrated.";
LAB_0029787a:
        iVar7 = 0;
        pline(pcVar19);
        goto switchD_002970ca_default;
      }
      if ((((youmonst.data)->mlet == '7') || (((youmonst.data)->mflags2 & 2) != 0)) ||
         ((youmonst.data == mons + 0x33 || (youmonst.data)->mlet == '\x16') ||
          ((youmonst.data)->mflags2 >> 9 & 1) != 0)) {
        shieldeff(x,(xchar)local_c0);
        pcVar19 = "You seem unaffected.";
        goto LAB_0029787a;
      }
      if ((u.uprops[0x2c].extrinsic != 0) ||
         ((u.umonnum != u.umonster && (bVar5 = resists_magm(&youmonst), bVar5 != '\0')))) {
        shieldeff(x,(xchar)local_c0);
        pcVar19 = "You aren\'t affected.";
        goto LAB_0029787a;
      }
LAB_00297fd7:
      killer_format = 0;
      killer = local_a0;
      u.ugrave_arise = local_4c;
      done(local_50);
      uVar27 = local_b0;
      goto LAB_002979a1;
    case 5:
      iVar7 = 0;
      local_b8 = uVar25;
      iVar8 = local_cc;
      for (iVar26 = local_cc; iVar26 != 0; iVar26 = iVar26 + -1) {
        uVar6 = mt_random();
        iVar7 = iVar8 + uVar6 % 6;
        iVar8 = iVar7;
      }
      elec_damageu(iVar7,(monst *)0x0,local_a0,0,7,'\x01');
      break;
    case 6:
      poisoned("blast",3,"poisoned blast",0xf);
      goto switchD_002970ca_default;
    case 7:
      iVar7 = 0;
      if ((u.uprops[7].extrinsic == 0) && (((byte)youmonst.mintrinsics & 0x40) == 0)) {
        pline("The acid burns!");
        iVar8 = local_cc;
        iVar7 = 0;
        for (iVar26 = local_cc; iVar26 != 0; iVar26 = iVar26 + -1) {
          uVar6 = mt_random();
          iVar8 = iVar8 + uVar6 % 6;
          iVar7 = iVar8;
        }
        exercise(0,'\0');
      }
      bVar31 = u.twoweap == '\0';
      uVar6 = mt_random();
      if (uVar6 % ((uint)bVar31 * 3 + 3) == 0) {
        erode_obj(uwep,'\x01','\x01');
      }
      uVar28 = local_c8;
      if ((u.twoweap != '\0') && (uVar6 = mt_random(), uVar6 * -0x55555555 < 0x55555556)) {
        erode_obj(uswapwep,'\x01','\x01');
      }
      uVar6 = mt_random();
      if ((uVar6 * -0x55555555 >> 1 | (uint)((uVar6 * -0x55555555 & 1) != 0) << 0x1f) < 0x2aaaaaab)
      {
        erode_armor(&youmonst,'\x01');
      }
    default:
      goto switchD_002970ca_default;
    }
    iVar7 = 0;
    uVar25 = local_b8;
    uVar28 = local_c8;
switchD_002970ca_default:
    if (((local_48 < 0xfffffff6) && ((int)local_b0 < 0)) &&
       ((u.uprops[0x32].extrinsic != 0 || u.uprops[0x32].intrinsic != 0 && (iVar7 != 0)))) {
      iVar7 = (iVar7 - (iVar7 + 1 >> 0x1f)) + 1 >> 1;
    }
    losehp(iVar7,local_a0,0);
    uVar27 = local_b0;
LAB_002978d2:
    if ((local_bc == 5) && (bVar5 = resists_blnd(&youmonst), bVar5 == '\0')) {
      local_c8 = uVar16;
      pline("You are blinded by the flash!");
      iVar7 = local_cc;
      iVar8 = local_cc;
      if (local_cc == 0) {
        lVar17 = 0;
      }
      else {
        do {
          uVar6 = mt_random();
          iVar8 = iVar8 + uVar6 % 0x32;
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        lVar17 = (long)iVar8;
        uVar27 = local_b0;
      }
      make_blinded(lVar17,'\0');
      uVar16 = local_c8;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0029796d;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00297968;
LAB_00297993:
        pline("Your vision quickly clears.");
      }
      else {
LAB_00297968:
        if (ublindf != (obj *)0x0) {
LAB_0029796d:
          if (ublindf->oartifact == '\x1d') goto LAB_00297993;
        }
      }
    }
LAB_002979a1:
    stop_occupation();
    nomul(0,(char *)0x0);
    uVar22 = local_98;
    uVar23 = local_88;
    uVar24 = local_90;
LAB_00297c5d:
    iVar7 = (int)uVar22;
    iVar26 = (int)uVar27;
    if ((((int)local_68 != 0x18) && (local_bc == 4)) && (*local_60 == '\r')) {
      *local_60 = '\x0e';
      if ((viz_array[uVar24][uVar23] & 2U) != 0) {
        pline("The tree withers!");
        newsym((int)local_80,local_c0);
      }
      goto LAB_00298135;
    }
    if ((*local_60 < '\x11') ||
       ((bVar5 = closed_door(level,(int)local_80,local_c0), bVar5 != '\0' && (-1 < iVar7)))) {
LAB_00297cbe:
      if ((int)uVar27 == 0xb) {
        local_a4 = (uint)uVar25;
        iVar7 = (int)local_70;
LAB_002980ac:
        tmp_at(-6,0);
        goto LAB_0029814c;
      }
      iVar7 = (int)uVar22 + -1;
      bVar13 = (byte)uVar25;
      if ((((byte)(cVar20 - 1U) < 0x4f) && (iVar7 != 0)) &&
         ((bVar13 < 0x15 && ((viz_array[uVar25 & 0xff][(int)local_70] & 2U) != 0)))) {
        The(local_a0);
        pline("%s bounces!");
      }
      iVar8 = (int)uVar16;
      if ((iVar8 != 0) && ((int)uVar28 != 0)) {
        uVar9 = mt_random();
        uVar6 = local_a4;
        if (0xccccccc < (uVar9 * -0x33333333 >> 2 | uVar9 * 0x40000000)) {
          bVar31 = true;
          local_c8 = uVar28;
          if (((byte)local_3c < 0x4f) && (bVar13 < 0x15)) {
            bVar2 = level->locations[(ulong)uVar21 & 0xff][uVar25 & 0xff].typ;
            if (0x10 < bVar2) {
              bVar5 = closed_door(level,(int)local_80,(int)(char)bVar13);
              if (bVar5 == '\0') {
                bVar31 = true;
                if ((0x18 < bVar2) ||
                   (((iVar8 + (int)local_80) - 1U < 0x4f &&
                    ('\x10' < level->locations[(uint)(iVar8 + (int)local_80)][uVar25 & 0xff].typ))))
                {
                  bVar31 = false;
                }
              }
              else {
                bVar31 = true;
              }
            }
          }
          uVar9 = local_bc;
          if (((byte)(cVar20 - 1U) < 0x4f) && ((byte)uVar6 < 0x15)) {
            lVar17 = (long)(int)local_70;
            bVar13 = level->locations[lVar17][uVar6 & 0xff].typ;
            if ((bVar13 < 0x11) ||
               (bVar5 = closed_door(level,(int)local_70,local_c0), bVar5 != '\0'))
            goto LAB_00297e23;
            if (bVar13 < 0x19) {
              if ((0x14 < (uint)(local_c0 + (int)local_c8)) ||
                 (level->locations[lVar17][(uint)(local_c0 + (int)local_c8)].typ < '\x11'))
              goto LAB_00297e23;
            }
            if ((!bVar31) && (uVar6 = mt_random(), (uVar6 & 1) == 0)) goto LAB_00297e2d;
            uVar16 = (ulong)(uint)-iVar8;
            uVar28 = local_c8;
          }
          else {
LAB_00297e23:
            uVar16 = uVar16 & 0xffffffff;
            if (bVar31) {
              uVar16 = (ulong)(uint)-iVar8;
            }
LAB_00297e2d:
            uVar28 = (ulong)(uint)-(int)local_c8;
          }
          uVar27 = local_b0;
          iVar8 = zapdir_to_effect((int)uVar16,(int)uVar28,uVar9,(boolean)local_40);
          tmp_at(-5,iVar8);
          goto LAB_00297e62;
        }
      }
      uVar16 = (ulong)(uint)-iVar8;
      uVar28 = (ulong)(uint)-(int)uVar28;
    }
LAB_00297e62:
    iVar26 = (int)uVar27;
    uVar22 = (ulong)(iVar7 - 1);
    if (iVar7 < 1) goto LAB_00298135;
  }
  worm = (monst *)0x0;
  if ((pmVar18->field_0x61 & 2) == 0) {
    worm = pmVar18;
  }
  uVar27 = local_b0;
  if ((viz_array[uVar24][uVar23] & 2U) != 0) {
    if (worm == (monst *)0x0) goto LAB_00296a69;
    if (worm->wormno == '\0') {
      local_b8 = uVar25;
      if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_00296b42;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00296ae5;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00296adc;
      }
      else {
LAB_00296adc:
        if (ublindf == (obj *)0x0) goto LAB_00296b93;
LAB_00296ae5:
        if (ublindf->oartifact != '\x1d') goto LAB_00296b93;
      }
      if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
           (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[worm->my][worm->mx] & 1U) != 0)
          ) && ((worm->data->mflags3 & 0x200) != 0)) goto LAB_00296b42;
    }
    else {
      local_b8 = uVar25;
      bVar5 = worm_known(level,worm);
      if (bVar5 != '\0') {
LAB_00296b42:
        uVar6 = *(uint *)&worm->field_0x60;
        if ((((uVar6 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar6 & 0x280) == 0) goto LAB_00296b85;
        }
        else if (((uVar6 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00296b85:
          if ((u._1052_1_ & 0x20) == 0) goto LAB_00296cf4;
        }
      }
    }
LAB_00296b93:
    if (((worm->data->mflags1 & 0x10000) == 0) &&
       ((poVar10 = which_armor(worm,4), poVar10 == (obj *)0x0 ||
        (poVar10 = which_armor(worm,4), poVar10->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00296bf2;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00296bed;
      }
      else {
LAB_00296bed:
        if (ublindf != (obj *)0x0) {
LAB_00296bf2:
          if (ublindf->oartifact == '\x1d') goto LAB_00296c84;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_00296cf4;
      }
LAB_00296c84:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar8 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar8 < 0x41))))
      goto LAB_00296cf4;
    }
    if ((u.uprops[0x42].intrinsic == 0) &&
       ((u.uprops[0x42].extrinsic == 0 && (bVar5 = match_warn_of_mon(worm), bVar5 == '\0')))) {
      map_invisible(x,(xchar)local_c0);
    }
    goto LAB_00296cf4;
  }
LAB_00296d39:
  bhitpos.y = (xchar)local_a4;
  bhitpos.x = x;
  iVar8 = (int)uVar27;
  if (iVar8 == 0xb) {
    uVar23 = local_88;
    uVar24 = local_90;
    if (worm == (monst *)0x0) goto LAB_00296e9a;
    iVar7 = (int)local_80;
    goto LAB_002980ac;
  }
  iVar26 = zap_over_floor(x,(xchar)local_c0,iVar8,&local_cd);
  uVar22 = (ulong)(uint)((int)uVar22 + iVar26);
  uVar23 = local_88;
  uVar24 = local_90;
  if (worm == (monst *)0x0) goto LAB_00296e9a;
  local_98 = uVar22;
  if (-1 < iVar8) {
    pbVar1 = (byte *)((long)&worm->mstrategy + 3);
    *pbVar1 = *pbVar1 & 0xcf;
  }
LAB_00296d9e:
  iVar26 = (int)uVar27;
  iVar8 = find_mac(worm);
  iVar8 = zap_hit_check(iVar8,local_44);
  if (iVar8 == 0) {
    miss(local_a0,worm);
    uVar22 = local_98;
    uVar23 = local_88;
    uVar24 = local_90;
    uVar28 = local_c8;
    goto LAB_00297c5d;
  }
  if ((bVar15 || bVar29 && bVar30) && (bVar5 = mon_reflects(worm,(char *)0x0), bVar5 != '\0')) {
    if ((viz_array[worm->my][worm->mx] & 2U) != 0) {
      hit(local_a0,'\0',worm,".");
      shieldeff(worm->mx,worm->my);
      mon_reflects(worm,"But it reflects from %s %s!");
    }
    uVar16 = (ulong)(uint)-iVar7;
    iVar7 = (int)local_98;
    uVar23 = local_88;
    uVar24 = local_90;
    uVar28 = (ulong)(uint)-(int)local_c8;
LAB_00297c59:
    uVar22 = (ulong)(iVar7 - 2);
    goto LAB_00297c5d;
  }
  uVar6 = *(uint *)&worm->field_0x60;
  local_b8 = uVar25;
  uVar9 = zap_hit_mon(worm,iVar26,local_cc,&local_58);
  poVar10 = local_58;
  ppVar3 = worm->data;
  if (((int)local_68 == 0x18) &&
     ((ppVar3 == mons + 0x144 || ppVar3 == mons + 0x146) || ppVar3 == mons + 0x145)) {
    if (worm->wormno == '\0') {
      if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_0029836c;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002982a8;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0029829f;
      }
      else {
LAB_0029829f:
        if (ublindf == (obj *)0x0) goto LAB_00298488;
LAB_002982a8:
        if (ublindf->oartifact != '\x1d') goto LAB_00298488;
      }
      if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
           (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[worm->my][worm->mx] & 1U) != 0)
          ) && ((ppVar3->mflags3 & 0x200) != 0)) goto LAB_0029836c;
    }
    else {
      bVar5 = worm_known(level,worm);
      if (bVar5 != '\0') {
LAB_0029836c:
        uVar21 = *(uint *)&worm->field_0x60;
        if ((((uVar21 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) {
          if ((uVar21 & 0x280) == 0) goto LAB_002983b6;
        }
        else if (((uVar21 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_002983b6:
          if ((u._1052_1_ & 0x20) == 0) {
            hit(local_a0,'\0',worm,".");
            pcVar19 = Monnam(worm);
            pline("%s disintegrates.",pcVar19);
            pcVar19 = Monnam(worm);
            pcVar19 = s_suffix(pcVar19);
            if ((((youmonst.data)->mflags1 & 0x1000) == 0) &&
               (youmonst.data == mons + 0x1e || youmonst.data == mons + 0x17b)) {
              pcVar11 = body_part(1);
            }
            else {
              pcVar11 = body_part(1);
              pcVar11 = makeplural(pcVar11);
            }
            pline("%s body reintegrates before your %s!",pcVar19,pcVar11);
            Monnam(worm);
            pline("%s resurrects!");
          }
        }
      }
    }
LAB_00298488:
    worm->mhp = worm->mhpmax;
    goto LAB_00298135;
  }
  if ((local_bc != 4) || (ppVar3 != local_38)) {
    if (uVar9 == 1000) {
      poVar10 = mlifesaver(worm);
      if (worm->wormno == '\0') {
        if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_002976e5;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00297208;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002971ff;
        }
        else {
LAB_002971ff:
          if (ublindf == (obj *)0x0) goto LAB_002979e1;
LAB_00297208:
          if (ublindf->oartifact != '\x1d') goto LAB_002979e1;
        }
        if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
             (((youmonst.data)->mflags3 & 0x100) != 0)) &&
            ((viz_array[worm->my][worm->mx] & 1U) != 0)) && ((worm->data->mflags3 & 0x200) != 0))
        goto LAB_002976e5;
      }
      else {
        bVar5 = worm_known(level,worm);
        if (bVar5 != '\0') {
LAB_002976e5:
          uVar6 = *(uint *)&worm->field_0x60;
          if ((((uVar6 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar6 & 0x280) == 0) goto LAB_00297731;
          }
          else if (((uVar6 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00297731:
            if ((u._1052_1_ & 0x20) == 0) {
              if (poVar10 == (obj *)0x0) {
                Monnam(worm);
                pline("%s is disintegrated!");
              }
              else {
                hit(local_a0,'\0',worm,"!");
              }
            }
          }
        }
      }
LAB_002979e1:
      poVar4 = worm->minvent;
      while (obj = poVar4, uVar27 = local_b0, obj != (obj *)0x0) {
        poVar4 = obj->nobj;
        if ((obj == poVar10) ||
           (((objects[obj->otyp].oc_oprop != '\x04' &&
             (bVar5 = obj_resists(obj,5,0x32), bVar5 == '\0')) &&
            (bVar5 = is_quest_artifact(obj), bVar5 == '\0')))) {
          if ((obj->owornmask != 0) && (obj->otyp == 0xf0)) {
            pbVar1 = (byte *)((long)&worm->misc_worn_check + 2);
            *pbVar1 = *pbVar1 & 0xef;
          }
          update_mon_intrinsics(level,worm,obj,'\0','\x01');
          obj_extract_self(obj);
          obfree(obj,(obj *)0x0);
        }
      }
      local_58 = (obj *)0x0;
      if ((int)local_b0 < 0) {
        iVar7 = -0xf2;
        pcVar19 = (char *)0x0;
LAB_00297aaa:
        monkilled(worm,pcVar19,iVar7);
      }
      else {
        xkilled(worm,2);
      }
    }
    else {
      if (0 < worm->mhp) {
        if (local_58 == (obj *)0x0) {
          pcVar19 = "!";
          if (uVar9 < 5) {
            pcVar19 = ".";
          }
          if ((int)uVar9 < 0) {
            pcVar19 = "?";
          }
          hit(local_a0,'\0',worm,pcVar19);
        }
        else {
          if (worm->wormno == '\0') {
            if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_00297b64;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002972f3;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002972ea;
            }
            else {
LAB_002972ea:
              if (ublindf == (obj *)0x0) goto LAB_00297bf9;
LAB_002972f3:
              if (ublindf->oartifact != '\x1d') goto LAB_00297bf9;
            }
            if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                 (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                ((viz_array[worm->my][worm->mx] & 1U) != 0)) && ((ppVar3->mflags3 & 0x200) != 0))
            goto LAB_00297b64;
          }
          else {
            bVar5 = worm_known(level,worm);
            if (bVar5 != '\0') {
LAB_00297b64:
              uVar9 = *(uint *)&worm->field_0x60;
              if ((((uVar9 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar9 & 0x280) == 0) goto LAB_00297bb3;
              }
              else if (((uVar9 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00297bb3:
                if ((u._1052_1_ & 0x20) == 0) {
                  pcVar19 = Monnam(worm);
                  pcVar19 = s_suffix(pcVar19);
                  pcVar11 = distant_name(poVar10,xname);
                  pline("%s %s is disintegrated!",pcVar19,pcVar11);
                }
              }
            }
          }
LAB_00297bf9:
          m_useup(worm,poVar10);
        }
        uVar23 = local_88;
        uVar24 = local_90;
        uVar27 = local_b0;
        iVar7 = (int)local_98;
        uVar25 = local_b8;
        uVar28 = local_c8;
        if (((uVar6 >> 0x12 & 1) != 0) && ((worm->field_0x62 & 4) == 0)) {
          slept_monst(worm);
          iVar7 = (int)local_98;
          uVar25 = local_b8;
          uVar28 = local_c8;
        }
        goto LAB_00297c59;
      }
      if (iVar26 < 0) {
        iVar7 = 0xf2;
        pcVar19 = local_a0;
        goto LAB_00297aaa;
      }
      killed(worm);
    }
    iVar7 = (int)local_98;
    uVar23 = local_88;
    uVar24 = local_90;
    uVar25 = local_b8;
    uVar28 = local_c8;
    goto LAB_00297c59;
  }
  if (worm->wormno == '\0') {
    if ((viz_array[worm->my][worm->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00298301;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002982f8;
      }
      else {
LAB_002982f8:
        if (ublindf == (obj *)0x0) goto LAB_00298135;
LAB_00298301:
        if (ublindf->oartifact != '\x1d') goto LAB_00298135;
      }
      if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
           (((youmonst.data)->mflags3 & 0x100) == 0)) || ((viz_array[worm->my][worm->mx] & 1U) == 0)
          ) || ((ppVar3->mflags3 & 0x200) == 0)) goto LAB_00298135;
    }
  }
  else {
    bVar5 = worm_known(level,worm);
    if (bVar5 == '\0') goto LAB_00298135;
  }
  uVar21 = *(uint *)&worm->field_0x60;
  if ((((uVar21 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
    if ((uVar21 & 0x280) != 0) goto LAB_00298135;
  }
  else if (((uVar21 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
  goto LAB_00298135;
  if ((u._1052_1_ & 0x20) == 0) {
    hit(local_a0,'\0',worm,".");
    pcVar19 = Monnam(worm);
    pcVar11 = "ray";
    if (iVar26 == 0x18) {
      pcVar11 = "bolt";
    }
    pline("%s absorbs the deadly %s!",pcVar19,pcVar11);
    pline("It seems even stronger than before.");
  }
LAB_00298135:
  tmp_at(-6,0);
  iVar7 = (int)local_80;
  if (iVar26 == 0xb) {
LAB_0029814c:
    iVar8 = 0xc;
    iVar26 = -0xc;
    do {
      uVar21 = mt_random();
      iVar8 = iVar8 + uVar21 % 6;
      iVar26 = iVar26 + 1;
    } while (iVar26 != 0);
    explode(iVar7,(int)(char)local_a4,0xb,iVar8,'\0',5);
  }
  if (local_cd != '\0') {
    if (local_bc == 1) {
      pcVar19 = "burn away";
    }
    else if (local_bc == 2) {
      pcVar19 = "shatter";
    }
    else {
      pcVar19 = "destroy";
      if (local_bc == 4) {
        pcVar19 = "disintegrate";
      }
    }
    pay_for_damage(pcVar19,'\0');
  }
  bhitpos = local_72;
  return;
}

Assistant:

void buzz(int type, int nd, xchar sx, xchar sy, int dx, int dy)
{
    int range, abstype = abs(type) % 10;
    struct rm *loc;
    xchar lsx, lsy;
    struct monst *mon;
    coord save_bhitpos;
    boolean shopdamage = FALSE;
    const char *fltxt;
    struct obj *otmp;
    int spell_type;
    boolean is_breath = (type >= 20 && type <= 29) ||
			(type >= -29 && type <= -20);
    /* show breath glyphs for non-reflectable breaths (any but disintegration) */
    boolean show_breath_glyph = is_breath && abs(type) != ZT_BREATH(ZT_DEATH);

    /* if its a Hero Spell then get its SPE_TYPE */
    spell_type = is_hero_spell(type) ? SPE_MAGIC_MISSILE + abstype : 0;

    fltxt = flash_types[(type <= -30) ? abstype : abs(type)];
    if (u.uswallow) {
	int tmp;

	if (type < 0) return;
	tmp = zap_hit_mon(u.ustuck, type, nd, &otmp);
	if (!u.ustuck)	u.uswallow = 0;
	else	pline("%s rips into %s%s",
		      The(fltxt), mon_nam(u.ustuck), exclam(tmp));
	/* Using disintegration from the inside only makes a hole... */
	if (tmp == MAGIC_COOKIE)
	    u.ustuck->mhp = 0;
	if (u.ustuck->mhp < 1)
	    killed(u.ustuck);
	return;
    }
    if (type < 0) newsym(u.ux,u.uy);
    range = rn1(7,7);
    if (dx == 0 && dy == 0) range = 1;
    save_bhitpos = bhitpos;

    tmp_at(DISP_BEAM, zapdir_to_effect(dx, dy, abstype, show_breath_glyph));
    while (range-- > 0) {
	lsx = sx; sx += dx;
	lsy = sy; sy += dy;
	if (isok(sx,sy) && (loc = &level->locations[sx][sy])->typ) {
	    mon = m_at(level, sx, sy);
	    if (cansee(sx,sy)) {
		/* reveal/unreveal invisible monsters before tmp_at() */
		if (mon && !canspotmon(level, mon))
		    map_invisible(sx, sy);
		else if (!mon && level->locations[sx][sy].mem_invis) {
		    unmap_object(sx, sy);
		    newsym(sx, sy);
		}
		if (ZAP_POS(loc->typ) || (isok(lsx,lsy) && cansee(lsx,lsy)))
		    tmp_at(sx,sy);
		win_delay_output(); /* wait a little */
	    }
	} else
	    goto make_bounce;

	/* hit() and miss() need bhitpos to match the target */
	bhitpos.x = sx,  bhitpos.y = sy;
	/* Fireballs only damage when they explode */
	if (type != ZT_SPELL(ZT_FIRE))
	    range += zap_over_floor(sx, sy, type, &shopdamage);

	if (mon) {
	    if (type == ZT_SPELL(ZT_FIRE)) break;
	    if (type >= 0) mon->mstrategy &= ~STRAT_WAITMASK;
buzzmonst:
	    if (zap_hit_check(find_mac(mon), spell_type)) {
		/* breaths (except disintegration) are not blocked by reflection */
		if ((!is_breath || abs(type) == ZT_BREATH(ZT_DEATH)) &&
		    mon_reflects(mon, NULL)) {
		    if (cansee(mon->mx,mon->my)) {
			hit(fltxt, FALSE, mon, exclam(0));
			shieldeff(mon->mx, mon->my);
			mon_reflects(mon, "But it reflects from %s %s!");
		    }
		    dx = -dx;
		    dy = -dy;
		} else {
		    boolean mon_could_move = mon->mcanmove;
		    int tmp = zap_hit_mon(mon, type, nd, &otmp);

		    if (is_rider(mon->data) && abs(type) == ZT_BREATH(ZT_DEATH)) {
			if (canseemon(level, mon)) {
			    hit(fltxt, FALSE, mon, ".");
			    pline("%s disintegrates.", Monnam(mon));
			    pline("%s body reintegrates before your %s!",
				  s_suffix(Monnam(mon)),
				  (eyecount(youmonst.data) == 1) ?
				  	body_part(EYE) : makeplural(body_part(EYE)));
			    pline("%s resurrects!", Monnam(mon));
			}
			mon->mhp = mon->mhpmax;
			break; /* Out of while loop */
		    }
		    if (mon->data == &mons[PM_DEATH] && abstype == ZT_DEATH) {
			if (canseemon(level, mon)) {
			    hit(fltxt, FALSE, mon, ".");
			    pline("%s absorbs the deadly %s!", Monnam(mon),
				  type == ZT_BREATH(ZT_DEATH) ?
					"bolt" : "ray");
			    pline("It seems even stronger than before.");
			}
			break; /* Out of while loop */
		    }

		    if (tmp == MAGIC_COOKIE) { /* disintegration */
			struct obj *otmp2, *m_amulet = mlifesaver(mon);

			if (canseemon(level, mon)) {
			    if (!m_amulet)
				pline("%s is disintegrated!", Monnam(mon));
			    else
				hit(fltxt, FALSE, mon, "!");
			}

/* note: worn amulet of life saving must be preserved in order to operate */
#ifndef oresist_disintegration
#define oresist_disintegration(obj) \
		(objects[obj->otyp].oc_oprop == DISINT_RES || \
		 obj_resists(obj, 5, 50) || is_quest_artifact(obj) || \
		 obj == m_amulet)
#endif

			for (otmp = mon->minvent; otmp; otmp = otmp2) {
			    otmp2 = otmp->nobj;
			    if (otmp == m_amulet || !oresist_disintegration(otmp)) {
				/* update the monsters intrinsics and saddle in
				 * case it is lifesaved. */
				if (otmp->owornmask && otmp->otyp == SADDLE)
				    mon->misc_worn_check &= ~W_SADDLE;
				update_mon_intrinsics(level, mon, otmp, FALSE, TRUE);
				obj_extract_self(otmp);
				obfree(otmp, NULL);
			    }
			}

			if (type < 0)
			    monkilled(mon, NULL, -AD_RBRE);
			else
			    xkilled(mon, 2);
		    } else if (mon->mhp < 1) {
			if (type < 0)
			    monkilled(mon, fltxt, AD_RBRE);
			else
			    killed(mon);
		    } else {
			if (!otmp) {
			    /* normal non-fatal hit */
			    hit(fltxt, FALSE, mon, exclam(tmp));
			} else {
			    /* some armor was destroyed; no damage done */
			    if (canseemon(level, mon))
				pline("%s %s is disintegrated!",
				      s_suffix(Monnam(mon)),
				      distant_name(otmp, xname));
			    m_useup(mon, otmp);
			}
			if (mon_could_move && !mon->mcanmove)	/* ZT_SLEEP */
			    slept_monst(mon);
		    }
		}
		range -= 2;
	    } else {
		miss(fltxt,mon);
	    }
	} else if (sx == u.ux && sy == u.uy && range >= 0) {
	    nomul(0, NULL);
	    /* breaths (except disintegration) are not blocked by reflection */
	    if (u.usteed && !rn2(3) &&
		!((!is_breath || abs(type) == ZT_BREATH(ZT_DEATH)) &&
		  mon_reflects(u.usteed, NULL))) {
		    mon = u.usteed;
		    goto buzzmonst;
	    } else if (zap_hit_check((int) u.uac, 0)) {
		range -= 2;
		pline("%s hits you!", The(fltxt));
		/* breaths (except disintegration) are not blocked by reflection */
		if ((!is_breath || abs(type) == ZT_BREATH(ZT_DEATH)) && Reflecting) {
		    if (!Blind) {
		    	ureflects("But %s reflects from your %s!", "it");
		    } else
			pline("For some reason you are not affected.");
		    dx = -dx;
		    dy = -dy;
		    shieldeff(sx, sy);
		} else {
		    zap_hit_u(type, nd, fltxt, sx, sy);
		}
	    } else {
		pline("%s whizzes by you!", The(fltxt));
	    }
	    if (abstype == ZT_LIGHTNING && !resists_blnd(&youmonst)) {
		pline(blinded_by_the_flash);
		make_blinded((long)dice(nd,50),FALSE);
		if (!Blind) pline("Your vision quickly clears.");
	    }
	    stop_occupation();
	    nomul(0, NULL);
	}

	if (loc->typ == TREE && abstype == ZT_DEATH &&
	    abs(type) != ZT_BREATH(ZT_DEATH)) {
	    loc->typ = DEADTREE;
	    if (cansee(sx, sy)) {
		pline("The tree withers!");
		newsym(sx, sy);
	    }
	    range = 0;
	    break;
	}

	if (!ZAP_POS(loc->typ) || (closed_door(level, sx, sy) && (range >= 0))) {
	    int bounce;
	    uchar rmn;

 make_bounce:
	    if (type == ZT_SPELL(ZT_FIRE)) {
		sx = lsx;
		sy = lsy;
		break; /* fireballs explode before the wall */
	    }
	    bounce = 0;
	    range--;
	    if (range && isok(lsx, lsy) && cansee(lsx,lsy))
		pline("%s bounces!", The(fltxt));
	    if (!dx || !dy || !rn2(20)) {
		dx = -dx;
		dy = -dy;
	    } else {
		if (isok(sx,lsy) && ZAP_POS(rmn = level->locations[sx][lsy].typ) &&
		   !closed_door(level, sx,lsy) &&
		   (IS_ROOM(rmn) || (isok(sx+dx,lsy) &&
				     ZAP_POS(level->locations[sx+dx][lsy].typ))))
		    bounce = 1;
		if (isok(lsx,sy) && ZAP_POS(rmn = level->locations[lsx][sy].typ) &&
		   !closed_door(level, lsx,sy) &&
		   (IS_ROOM(rmn) || (isok(lsx,sy+dy) &&
				     ZAP_POS(level->locations[lsx][sy+dy].typ))))
		    if (!bounce || rn2(2))
			bounce = 2;

		switch(bounce) {
		case 0: dx = -dx; /* fall into... */
		case 1: dy = -dy; break;
		case 2: dx = -dx; break;
		}
		tmp_at(DISP_CHANGE, zapdir_to_effect(dx, dy, abstype,
						     show_breath_glyph));
	    }
	}
    }
    tmp_at(DISP_END,0);
    if (type == ZT_SPELL(ZT_FIRE))
	explode(sx, sy, type, dice(12,6), 0, EXPL_FIERY);
    if (shopdamage)
	pay_for_damage(abstype == ZT_FIRE ?  "burn away" :
		       abstype == ZT_COLD ?  "shatter" :
		       abstype == ZT_DEATH ? "disintegrate" : "destroy", FALSE);
    bhitpos = save_bhitpos;
}